

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

w_status wp_log_va(w_log_lvl lvl,char *file,int line,char *msg,__va_list_tag *args)

{
  int iVar1;
  w_status wVar2;
  w_status unaff_R13D;
  
  if (W_LOG_LVL_ALL < lvl) {
    w_handle_failed_assertion
              ("lvl >= 0 && lvl < WP_LOG_LVL_END","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe3);
  }
  if (file == (char *)0x0) {
    w_handle_failed_assertion
              ("file != NULL","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe4);
  }
  if (msg == (char *)0x0) {
    w_handle_failed_assertion
              ("msg != NULL","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe5);
  }
  iVar1 = w_mtx_lock(&wp_log_mtx);
  if (iVar1 != 0) {
    return W_ERROR_LOCK_FAILED;
  }
  if (wp_log_va_initialized == '\0') {
    wp_log_is_std_err_console = w_is_console(_stderr);
    wp_log_va_initialized = '\x01';
  }
  wVar2 = ~W_ERROR_FILE_OPEN_FAILED;
  if ((wp_log_logger_pool[0].valid == 0) || (wp_log_logger_pool[0].lvl < lvl)) goto LAB_00103a30;
  if (wp_log_logger_pool[0].fmt == W_LOG_FMT_PLAIN_STYLIZED) {
    iVar1 = 1;
LAB_001039f0:
    wVar2 = wp_log_fmt_plain(wp_log_logger_pool[0].stream,lvl,file,line,iVar1,msg,args);
  }
  else {
    if (wp_log_logger_pool[0].fmt == W_LOG_FMT_PLAIN) {
      iVar1 = 0;
      goto LAB_001039f0;
    }
    w_handle_failed_assertion
              ("0","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0x10b);
    wVar2 = unaff_R13D;
  }
  if (wVar2 != W_SUCCESS) {
    wVar2 = ~W_ERROR_IO_FAILED;
  }
LAB_00103a30:
  wVar2 = (*(code *)(&DAT_00105ee0 + *(int *)(&DAT_00105ee0 + (ulong)(uint)wVar2 * 4)))();
  return wVar2;
}

Assistant:

enum w_status
wp_log_va(
    enum w_log_lvl lvl,
    const char *file,
    int line,
    const char *msg,
    va_list args
)
{
    static int32_t initialized = 0;

    enum w_status status;
    uint16_t i;
    int has_registered_logger;

    W_ASSERT(lvl >= 0 && lvl < WP_LOG_LVL_END);
    W_ASSERT(file != NULL);
    W_ASSERT(msg != NULL);

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    if (!initialized)
    {
        wp_log_is_std_err_console = w_is_console(W_STD_ERR);
        initialized = 1;
    }

    has_registered_logger = 0;
    for (i = 0; i < W_GET_ARRAY_LEN(wp_log_logger_pool); ++i)
    {
        struct wp_log_logger *logger;

        logger = &wp_log_logger_pool[i];
        if (!logger->valid || (logger->lvl < lvl))
        {
            continue;
        }

        has_registered_logger = 1;
        switch (logger->fmt)
        {
            case W_LOG_FMT_PLAIN:
                status = wp_log_fmt_plain(
                    logger->stream, lvl, file, line, 0, msg, args
                );
                break;
            case W_LOG_FMT_PLAIN_STYLIZED:
                status = wp_log_fmt_plain(
                    logger->stream, lvl, file, line, 1, msg, args
                );
                break;
            default:
                W_ASSERT(0);
        }

        if (status != W_SUCCESS)
        {
            goto exit;
        }
    }

    // Fallback to a default logger if none was explicitly registered.
    if (!has_registered_logger)
    {
        status = wp_log_fmt_plain(
            W_STD_ERR,
            lvl,
            file,
            line,
            wp_log_is_std_err_console,
            msg,
            args
        );

        if (status != W_SUCCESS)
        {
            goto exit;
        }
    }

exit:
    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        status = W_ERROR_UNLOCK_FAILED;
    }

    return status;
}